

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32 tag)

{
  CodedInputStream *this;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  uint32 expected;
  uint32 local_38;
  uint32 local_34;
  uint32 value_2;
  uint32 length;
  uint64 value_1;
  uint64 value;
  CodedInputStream *pCStack_18;
  uint32 tag_local;
  CodedInputStream *input_local;
  
  value._4_4_ = tag;
  pCStack_18 = input;
  iVar2 = GetTagFieldNumber(tag);
  if (iVar2 == 0) {
    input_local._7_1_ = false;
  }
  else {
    WVar3 = GetTagWireType(value._4_4_);
    switch(WVar3) {
    case WIRETYPE_VARINT:
      bVar1 = io::CodedInputStream::ReadVarint64(pCStack_18,&value_1);
      if (bVar1) {
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_FIXED64:
      bVar1 = io::CodedInputStream::ReadLittleEndian64(pCStack_18,(uint64 *)&value_2);
      if (bVar1) {
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_LENGTH_DELIMITED:
      bVar1 = io::CodedInputStream::ReadVarint32(pCStack_18,&local_34);
      if (bVar1) {
        bVar1 = io::CodedInputStream::Skip(pCStack_18,local_34);
        if (bVar1) {
          input_local._7_1_ = true;
        }
        else {
          input_local._7_1_ = false;
        }
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_START_GROUP:
      bVar1 = io::CodedInputStream::IncrementRecursionDepth(pCStack_18);
      if (bVar1) {
        bVar1 = SkipMessage(pCStack_18);
        if (bVar1) {
          io::CodedInputStream::DecrementRecursionDepth(pCStack_18);
          this = pCStack_18;
          iVar2 = GetTagFieldNumber(value._4_4_);
          expected = MakeTag(iVar2,WIRETYPE_END_GROUP);
          bVar1 = io::CodedInputStream::LastTagWas(this,expected);
          if (bVar1) {
            input_local._7_1_ = true;
          }
          else {
            input_local._7_1_ = false;
          }
        }
        else {
          input_local._7_1_ = false;
        }
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_END_GROUP:
      input_local._7_1_ = false;
      break;
    case WIRETYPE_FIXED32:
      bVar1 = io::CodedInputStream::ReadLittleEndian32(pCStack_18,&local_38);
      if (bVar1) {
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    default:
      input_local._7_1_ = false;
    }
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormatLite::SkipField(
    io::CodedInputStream* input, uint32 tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(WireFormatLite::MakeTag(
          WireFormatLite::GetTagFieldNumber(tag),
          WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}